

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quat4f.cpp
# Opt level: O3

void __thiscall Quat4f::Quat4f(Quat4f *this,Vector3f *v)

{
  float *pfVar1;
  
  this->m_elements[0] = 0.0;
  pfVar1 = Vector3f::operator[](v,0);
  this->m_elements[1] = *pfVar1;
  pfVar1 = Vector3f::operator[](v,1);
  this->m_elements[2] = *pfVar1;
  pfVar1 = Vector3f::operator[](v,2);
  this->m_elements[3] = *pfVar1;
  return;
}

Assistant:

Quat4f::Quat4f( const Vector3f& v )
{
	m_elements[ 0 ] = 0;
	m_elements[ 1 ] = v[ 0 ];
	m_elements[ 2 ] = v[ 1 ];
	m_elements[ 3 ] = v[ 2 ];
}